

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser * init_parse_meth(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_meth_name);
  parser_reg(p,"cut uint cut",parse_meth_cut);
  parser_reg(p,"stun uint stun",parse_meth_stun);
  parser_reg(p,"miss uint miss",parse_meth_miss);
  parser_reg(p,"phys uint phys",parse_meth_phys);
  parser_reg(p,"msg ?str msg",parse_meth_message_type);
  parser_reg(p,"act str act",parse_meth_act_msg);
  parser_reg(p,"desc str desc",parse_meth_desc);
  return p;
}

Assistant:

static struct parser *init_parse_meth(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_meth_name);
	parser_reg(p, "cut uint cut", parse_meth_cut);
	parser_reg(p, "stun uint stun", parse_meth_stun);
	parser_reg(p, "miss uint miss", parse_meth_miss);
	parser_reg(p, "phys uint phys", parse_meth_phys);
	parser_reg(p, "msg ?str msg", parse_meth_message_type);
	parser_reg(p, "act str act", parse_meth_act_msg);
	parser_reg(p, "desc str desc", parse_meth_desc);
	return p;
}